

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMffc.c
# Opt level: O3

int Aig_NodeMffcExtendCut(Aig_Man_t *p,Aig_Obj_t *pNode,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vResult)

{
  Aig_Obj_t *pNode_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  Aig_Obj_t *pNode_01;
  uint uVar6;
  uint uVar7;
  
  if (0 < (long)vLeaves->nSize) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      uVar7 = *(uint *)((long)vLeaves->pArray[lVar5] + 0x1c) & 0xffffff;
      if (uVar7 < uVar6) {
        uVar7 = uVar6;
      }
      uVar6 = uVar7;
      lVar5 = lVar5 + 1;
    } while (vLeaves->nSize != lVar5);
    if (uVar6 != 0) {
      iVar1 = Aig_NodeDeref_rec(pNode,0,(float *)0x0,(float *)0x0);
      iVar2 = vLeaves->nSize;
      if (0 < iVar2) {
        iVar4 = 1000000000;
        lVar5 = 0;
        pNode_01 = (Aig_Obj_t *)0x0;
        do {
          pNode_00 = (Aig_Obj_t *)vLeaves->pArray[lVar5];
          if ((*(uint *)&pNode_00->field_0x1c & 0xffffff) == uVar6) {
            iVar2 = Aig_NodeDeref_rec(pNode_00,0,(float *)0x0,(float *)0x0);
            iVar3 = Aig_NodeRef_rec(pNode_00,0);
            if (iVar2 != iVar3) {
              __assert_fail("ConeCur1 == ConeCur2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigMffc.c"
                            ,0x123,
                            "int Aig_NodeMffcExtendCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                           );
            }
            iVar3 = iVar4;
            if (iVar2 <= iVar4) {
              iVar3 = iVar2;
            }
            if (iVar2 < iVar4) {
              pNode_01 = pNode_00;
            }
            iVar2 = vLeaves->nSize;
            iVar4 = iVar3;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < iVar2);
        if (pNode_01 != (Aig_Obj_t *)0x0) {
          if ((*(uint *)&pNode_01->field_0x18 & 7) - 7 < 0xfffffffe) {
            __assert_fail("Aig_ObjIsNode(pLeafBest)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigMffc.c"
                          ,0x126,
                          "int Aig_NodeMffcExtendCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                         );
          }
          iVar2 = Aig_NodeDeref_rec(pNode_01,0,(float *)0x0,(float *)0x0);
          vResult->nSize = 0;
          Aig_ManIncrementTravId(p);
          Aig_NodeMffcSupp_rec(p,pNode,0,vResult,1,pNode_01);
          iVar4 = Aig_NodeRef_rec(pNode_01,0);
          if (iVar2 == iVar4) {
            iVar2 = Aig_NodeRef_rec(pNode,0);
            if (iVar1 == iVar2) {
              return 1;
            }
            __assert_fail("ConeSize1 == ConeSize2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigMffc.c"
                          ,0x132,
                          "int Aig_NodeMffcExtendCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                         );
          }
          __assert_fail("ConeCur1 == ConeCur2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigMffc.c"
                        ,0x12f,
                        "int Aig_NodeMffcExtendCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                       );
        }
      }
      __assert_fail("pLeafBest != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigMffc.c"
                    ,0x125,
                    "int Aig_NodeMffcExtendCut(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)")
      ;
    }
  }
  return 0;
}

Assistant:

int Aig_NodeMffcExtendCut( Aig_Man_t * p, Aig_Obj_t * pNode, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vResult )
{
    Aig_Obj_t * pObj, * pLeafBest;
    int i, LevelMax, ConeSize1, ConeSize2, ConeCur1, ConeCur2, ConeBest;
    // dereference the current cut
    LevelMax = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
        LevelMax = Abc_MaxInt( LevelMax, (int)pObj->Level );
    if ( LevelMax == 0 )
        return 0;
    // dereference the cut
    ConeSize1 = Aig_NodeDeref_rec( pNode, 0, NULL, NULL );
    // try expanding each node in the boundary
    ConeBest = ABC_INFINITY;
    pLeafBest = NULL;
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
    {
        if ( (int)pObj->Level != LevelMax )
            continue;
        ConeCur1 = Aig_NodeDeref_rec( pObj, 0, NULL, NULL );
        if ( ConeBest > ConeCur1 )
        {
            ConeBest = ConeCur1;
            pLeafBest = pObj;
        }
        ConeCur2 = Aig_NodeRef_rec( pObj, 0 );
        assert( ConeCur1 == ConeCur2 );
    }
    assert( pLeafBest != NULL );
    assert( Aig_ObjIsNode(pLeafBest) );
    // deref the best leaf
    ConeCur1 = Aig_NodeDeref_rec( pLeafBest, 0, NULL, NULL );
    // collect the cut nodes
    Vec_PtrClear( vResult );
    Aig_ManIncrementTravId( p );
    Aig_NodeMffcSupp_rec( p, pNode, 0, vResult, 1, pLeafBest );
    // ref the nodes
    ConeCur2 = Aig_NodeRef_rec( pLeafBest, 0 );
    assert( ConeCur1 == ConeCur2 );
    // ref the original node
    ConeSize2 = Aig_NodeRef_rec( pNode, 0 );
    assert( ConeSize1 == ConeSize2 );
    return 1;
}